

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_file.cpp
# Opt level: O2

BOOL MoveFileExA(LPCSTR lpExistingFileName,LPCSTR lpNewFileName,DWORD dwFlags)

{
  long lVar1;
  int iVar2;
  BOOL BVar3;
  BOOL BVar4;
  DWORD DVar5;
  size_t sVar6;
  char *_Dst;
  char *_Dst_00;
  DWORD *pDVar7;
  int *piVar8;
  ulong count;
  long in_FS_OFFSET;
  undefined1 local_168 [8];
  stat buf;
  DWORD local_bc;
  undefined1 local_b8 [4];
  DWORD dwLastError;
  PathCharString destPS;
  PathCharString sourcePS;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  destPS._32_8_ = local_b8;
  destPS.m_size = 0;
  local_bc = 0;
  if (!PAL_InitializeChakraCoreCalled) goto LAB_00122e9c;
  CorUnix::InternalGetCurrentThread();
  if (3 < dwFlags) {
    fprintf(_stderr,"] %s %s:%d","MoveFileExA",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/file/pal_file.cpp"
            ,0x586);
    fprintf(_stderr,"dwFlags is invalid\n");
    local_bc = 0x57;
    DVar5 = 0x57;
    goto LAB_00122d1e;
  }
  sVar6 = strlen(lpExistingFileName);
  _Dst = StackString<32UL,_char>::OpenStringBuffer
                   ((StackString<32UL,_char> *)&destPS.m_count,(long)(int)sVar6);
  if (_Dst == (char *)0x0) {
LAB_00122d11:
    local_bc = 8;
    DVar5 = 8;
LAB_00122d1e:
    pDVar7 = (DWORD *)__errno_location();
    *pDVar7 = DVar5;
    BVar3 = 0;
  }
  else {
    strcpy_s(_Dst,(size_t)sourcePS.m_buffer,lpExistingFileName);
    destPS.m_count._0_1_ = 0;
    FILEDosToUnixPathA(_Dst);
    sVar6 = strlen(lpNewFileName);
    count = (ulong)(int)sVar6;
    _Dst_00 = StackString<32UL,_char>::OpenStringBuffer((StackString<32UL,_char> *)local_b8,count);
    if (_Dst_00 == (char *)0x0) goto LAB_00122d11;
    strcpy_s(_Dst_00,(size_t)destPS.m_buffer,lpNewFileName);
    if (count < destPS.m_size) {
      destPS.m_size = count;
    }
    *(undefined1 *)(destPS._32_8_ + destPS.m_size) = 0;
    FILEDosToUnixPathA(_Dst_00);
    if ((((dwFlags & 1) == 0) && (iVar2 = strcasecmp(_Dst,_Dst_00), iVar2 != 0)) &&
       (iVar2 = access(_Dst_00,0), iVar2 == 0)) {
      local_bc = 0xb7;
      DVar5 = 0xb7;
      goto LAB_00122d1e;
    }
    iVar2 = rename(_Dst,_Dst_00);
    if (((dwFlags & 1) != 0) && (iVar2 < 0)) {
      buf.__glibc_reserved[2] = (__syscall_slong_t)__errno_location();
      iVar2 = *(int *)buf.__glibc_reserved[2];
      if ((iVar2 == 0x14) || (iVar2 == 0x11)) {
        BVar3 = DeleteFileA(lpNewFileName);
        if (BVar3 == 0) {
          DVar5 = GetLastError();
          BVar3 = 0;
          piVar8 = (int *)buf.__glibc_reserved[2];
          local_bc = DVar5;
        }
        else {
          iVar2 = rename(_Dst,_Dst_00);
          BVar3 = 1;
          if (-1 < iVar2) goto LAB_00122d28;
          DVar5 = 0;
          piVar8 = (int *)buf.__glibc_reserved[2];
        }
        goto LAB_00122dc6;
      }
      BVar3 = 1;
      DVar5 = 0;
LAB_00122dc8:
      if (iVar2 == 2) {
        iVar2 = lstat64(_Dst,(stat64 *)local_168);
        if (iVar2 == -1) {
          FILEGetProperNotFoundError(_Dst,&local_bc);
          DVar5 = local_bc;
        }
        else {
          local_bc = 3;
          DVar5 = 3;
        }
LAB_00122ec8:
        if (DVar5 == 0) goto LAB_00122d28;
      }
      else {
        if (iVar2 != 0x16) {
          if (iVar2 == 0x12) {
            if (dwFlags < 2) {
              local_bc = 5;
              DVar5 = 5;
              goto LAB_00122d1e;
            }
            BVar3 = CopyFileA(lpExistingFileName,lpNewFileName,dwFlags & 1 ^ 1);
            if (BVar3 == 0) {
              local_bc = GetLastError();
              BVar3 = 0;
              DVar5 = local_bc;
            }
            else {
              BVar4 = DeleteFileA(lpExistingFileName);
              BVar3 = 1;
              if (BVar4 == 0) {
                if (PAL_InitializeChakraCoreCalled == false) goto LAB_00122e9c;
                DVar5 = GetLastError();
                local_bc = DVar5;
                BVar4 = DeleteFileA(lpNewFileName);
                if ((BVar4 == 0) && (PAL_InitializeChakraCoreCalled == false)) goto LAB_00122e9c;
              }
            }
          }
          else {
            local_bc = FILEGetLastErrorFromErrno();
            DVar5 = local_bc;
          }
          goto LAB_00122ec8;
        }
        local_bc = 0x20;
        DVar5 = 0x20;
      }
      goto LAB_00122d1e;
    }
    if (iVar2 < 0) {
      BVar3 = 1;
      DVar5 = 0;
      piVar8 = __errno_location();
LAB_00122dc6:
      iVar2 = *piVar8;
      goto LAB_00122dc8;
    }
    BVar3 = 1;
  }
LAB_00122d28:
  if (PAL_InitializeChakraCoreCalled != false) {
    StackString<32UL,_char>::~StackString((StackString<32UL,_char> *)local_b8);
    StackString<32UL,_char>::~StackString((StackString<32UL,_char> *)&destPS.m_count);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return BVar3;
    }
    __stack_chk_fail();
  }
LAB_00122e9c:
  abort();
}

Assistant:

BOOL
PALAPI
MoveFileExA(
        IN LPCSTR lpExistingFileName,
        IN LPCSTR lpNewFileName,
        IN DWORD dwFlags)
{
    CPalThread *pThread;
    int   result;
    int length = 0;
    PathCharString sourcePS;
    PathCharString destPS;
    char * source;
    char * dest;
    BOOL  bRet = TRUE;
    DWORD dwLastError = 0;

    PERF_ENTRY(MoveFileExA);
    ENTRY("MoveFileExA(lpExistingFileName=%p (%S), lpNewFileName=%p (%S), "
          "dwFlags=%#x)\n",
          lpExistingFileName?lpExistingFileName:"NULL",
          lpExistingFileName?lpExistingFileName:"NULL",
          lpNewFileName?lpNewFileName:"NULL",
          lpNewFileName?lpNewFileName:"NULL", dwFlags);

    pThread = InternalGetCurrentThread();
    /* only two flags are accepted */
    if ( dwFlags & ~(MOVEFILE_COPY_ALLOWED | MOVEFILE_REPLACE_EXISTING) )
    {
        ASSERT( "dwFlags is invalid\n" );
        dwLastError = ERROR_INVALID_PARAMETER;
        goto done;
    }

    length = strlen(lpExistingFileName);
    
    source = sourcePS.OpenStringBuffer(length);
    if (NULL == source)
    {
        dwLastError = ERROR_NOT_ENOUGH_MEMORY;
        goto done;
    }
    strcpy_s( source, sourcePS.GetSizeOf(), lpExistingFileName);
    sourcePS.CloseBuffer(length);
    
    FILEDosToUnixPathA( source );

    length = strlen(lpNewFileName);
    
    dest = destPS.OpenStringBuffer(length);
    if (NULL == dest)
    {
        dwLastError = ERROR_NOT_ENOUGH_MEMORY;
        goto done;
    }
    strcpy_s( dest, destPS.GetSizeOf(), lpNewFileName);
    destPS.CloseBuffer(length);
    
    FILEDosToUnixPathA( dest );

    if ( !(dwFlags & MOVEFILE_REPLACE_EXISTING) )
    {
#if HAVE_CASE_SENSITIVE_FILESYSTEM
        if ( strcmp(source, dest) != 0 )
#else   // HAVE_CASE_SENSITIVE_FILESYSTEM
        if ( strcasecmp(source, dest) != 0 )
#endif  // HAVE_CASE_SENSITIVE_FILESYSTEM
        {
            // Let things proceed normally if source and
            // dest are the same.
            if ( access(dest, F_OK) == 0 )
            {
                dwLastError = ERROR_ALREADY_EXISTS;
                goto done;
            }
        }
    }

    result = rename( source, dest );
    if ((result < 0) && (dwFlags & MOVEFILE_REPLACE_EXISTING) &&
        ((errno == ENOTDIR) || (errno == EEXIST)))
    {
        bRet = DeleteFileA( lpNewFileName );
        
        if ( bRet ) 
        {
            result = rename( source, dest );
        }
        else
        { 
            dwLastError = GetLastError();
        }
    } 

    if ( result < 0 )
    {
        switch( errno )
        {
        case EXDEV: /* we tried to link across devices */
        
            if ( dwFlags & MOVEFILE_COPY_ALLOWED )
            {
                BOOL bFailIfExists = !(dwFlags & MOVEFILE_REPLACE_EXISTING);
            
                /* if CopyFile fails here, so should MoveFailEx */
                bRet = CopyFileA( lpExistingFileName,
                          lpNewFileName,
                          bFailIfExists );
                /* CopyFile should set the appropriate error */
                if ( !bRet ) 
                {
                    dwLastError = GetLastError();
                }
                else
                {
                    if (!DeleteFileA(lpExistingFileName))
                    {
                        ERROR("Failed to delete the source file\n");
                        dwLastError = GetLastError();
                    
                        /* Delete the destination file if we're unable to delete 
                           the source file */
                        if (!DeleteFileA(lpNewFileName))
                        {
                            ERROR("Failed to delete the destination file\n");
                        }
                    }
                }
            }
            else
            {
                dwLastError = ERROR_ACCESS_DENIED;
            }
            break;
        case EINVAL: // tried to rename "." or ".."
            dwLastError = ERROR_SHARING_VIOLATION;
            break;
        case ENOENT:
            {
                struct stat buf;
                if (lstat(source, &buf) == -1)
                {
                    FILEGetProperNotFoundError(source, &dwLastError);
                }
                else
                {
                    dwLastError = ERROR_PATH_NOT_FOUND;
                }
            }
            break;
        default:
            dwLastError = FILEGetLastErrorFromErrno();
            break;
        }
    }

done:
    if ( dwLastError )
    {
        pThread->SetLastError( dwLastError );
        bRet = FALSE;
    }

    LOGEXIT( "MoveFileExA returns BOOL %d\n", bRet );
    PERF_EXIT(MoveFileExA);
    return bRet;
}